

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O2

void __thiscall
Area::Area(Area *this,Vector3f *corner,Vector3f *sideOne,Vector3f *sideTwo,Material *m)

{
  Vector3f local_24;
  
  (this->super_Object3D).type._M_dataplus._M_p = (pointer)&(this->super_Object3D).type.field_2;
  (this->super_Object3D).type._M_string_length = 0;
  (this->super_Object3D).type.field_2._M_local_buf[0] = '\0';
  (this->super_Object3D).material = m;
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013aaa0;
  Vector3f::Vector3f(&this->_corner,corner);
  Vector3f::Vector3f(&this->_sideOne,sideOne);
  Vector3f::Vector3f(&this->_sideTwo,sideTwo);
  Vector3f::cross(sideOne,sideTwo);
  Vector3f::normalized(&local_24);
  return;
}

Assistant:

Area(Vector3f &corner,
         Vector3f &sideOne,
         Vector3f &sideTwo,
         Material *m) : Object3D(m), _corner(corner),
                        _sideOne(sideOne), _sideTwo(sideTwo),
                        _normal(Vector3f::cross(sideOne,
                                                sideTwo).normalized()) {

    }